

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,bytes *args,unsigned_long *args_1)

{
  unsigned_long *in_RCX;
  object local_20;
  
  make_tuple<(pybind11::return_value_policy)1,pybind11::bytes,unsigned_long_const&>
            ((pybind11 *)&local_20,(bytes *)args_1,in_RCX);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&local_20);
  object::~object(&local_20);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}